

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactStateMachine.cpp
# Opt level: O0

void __thiscall
iDynTree::ContactStateMachine::contactMeasurementUpdate
          (ContactStateMachine *this,double currentTime,double contactNormalForce)

{
  bool bVar1;
  pointer this_00;
  unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_> *in_RDI;
  SchmittTrigger *in_XMM0_Qa;
  double in_XMM1_Qa;
  
  std::unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>::get
            (in_RDI);
  SchmittTrigger::updateDevice(in_XMM0_Qa,in_XMM1_Qa,(double)in_RDI);
  *(byte *)&in_RDI[1]._M_t.
            super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
            ._M_t.
            super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
            .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl =
       *(byte *)((long)&in_RDI[1]._M_t.
                        super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
                        .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl + 1)
       & 1;
  this_00 = std::
            unique_ptr<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>::
            get(in_RDI);
  bVar1 = SchmittTrigger::getState(this_00);
  *(bool *)((long)&in_RDI[1]._M_t.
                   super___uniq_ptr_impl<iDynTree::SchmittTrigger,_std::default_delete<iDynTree::SchmittTrigger>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_iDynTree::SchmittTrigger_*,_std::default_delete<iDynTree::SchmittTrigger>_>
                   .super__Head_base<0UL,_iDynTree::SchmittTrigger_*,_false>._M_head_impl + 1) =
       bVar1;
  return;
}

Assistant:

void ContactStateMachine::contactMeasurementUpdate(double currentTime, double contactNormalForce)
{
    m_contactSchmitt.get()->updateDevice(currentTime, contactNormalForce);
    m_previousState = m_currentState;
    m_currentState = m_contactSchmitt.get()->getState();
}